

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

size_t HUF_compress1X_usingCTable_internal_bmi2
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable)

{
  uint uVar1;
  size_t code;
  BIT_CStream_t *bitC_00;
  ulong in_RCX;
  long in_RDX;
  ulong in_RSI;
  void *in_RDI;
  long in_R8;
  size_t initErr;
  BIT_CStream_t bitC;
  size_t n;
  BYTE *op;
  BYTE *oend;
  BYTE *ostart;
  BYTE *ip;
  BIT_CStream_t *in_stack_fffffffffffffe98;
  BIT_CStream_t local_128;
  ulong local_100;
  long local_f0;
  long local_e0;
  long local_d8;
  ulong local_d0;
  size_t local_b0;
  long local_a8;
  uint local_9c;
  BIT_CStream_t *local_98;
  long local_90;
  uint local_84;
  BIT_CStream_t *local_80;
  long local_78;
  uint local_6c;
  BIT_CStream_t *local_68;
  long local_60;
  uint local_54;
  BIT_CStream_t *local_50;
  long local_48;
  uint local_3c;
  BIT_CStream_t *local_38;
  long local_30;
  uint local_24;
  BIT_CStream_t *local_20;
  long local_18;
  uint local_c;
  BIT_CStream_t *local_8;
  
  local_f0 = (long)in_RDI + in_RSI;
  if (in_RSI < 8) {
    local_b0 = 0;
  }
  else {
    local_e0 = in_RDX;
    local_d8 = in_R8;
    local_d0 = in_RCX;
    code = BIT_initCStream(&local_128,in_RDI,local_f0 - (long)in_RDI);
    uVar1 = ERR_isError(code);
    if (uVar1 == 0) {
      local_100 = local_d0 & 0xfffffffffffffffc;
      bitC_00 = (BIT_CStream_t *)(ulong)((uint)local_d0 & 3);
      switch(bitC_00) {
      case (BIT_CStream_t *)0x3:
        local_98 = &local_128;
        local_9c = (uint)*(byte *)(local_e0 + 2 + local_100);
        local_a8 = local_d8;
        BIT_addBitsFast(local_98,(ulong)*(ushort *)(local_d8 + (ulong)local_9c * 4),
                        (uint)*(byte *)(local_d8 + 2 + (ulong)local_9c * 4));
      case (BIT_CStream_t *)0x2:
        local_80 = &local_128;
        local_84 = (uint)*(byte *)(local_e0 + 1 + local_100);
        local_90 = local_d8;
        BIT_addBitsFast(local_80,(ulong)*(ushort *)(local_d8 + (ulong)local_84 * 4),
                        (uint)*(byte *)(local_d8 + 2 + (ulong)local_84 * 4));
      case (BIT_CStream_t *)0x1:
        local_68 = &local_128;
        local_6c = (uint)*(byte *)(local_e0 + local_100);
        local_78 = local_d8;
        BIT_addBitsFast(local_68,(ulong)*(ushort *)(local_d8 + (ulong)local_6c * 4),
                        (uint)*(byte *)(local_d8 + 2 + (ulong)local_6c * 4));
        BIT_flushBits(bitC_00);
      case (BIT_CStream_t *)0x0:
      default:
        for (; local_100 != 0; local_100 = local_100 - 4) {
          local_8 = &local_128;
          local_c = (uint)*(byte *)(local_e0 + (local_100 - 1));
          local_18 = local_d8;
          BIT_addBitsFast(local_8,(ulong)*(ushort *)(local_d8 + (ulong)local_c * 4),
                          (uint)*(byte *)(local_d8 + 2 + (ulong)local_c * 4));
          local_20 = &local_128;
          local_24 = (uint)*(byte *)(local_e0 + (local_100 - 2));
          local_30 = local_d8;
          BIT_addBitsFast(local_20,(ulong)*(ushort *)(local_d8 + (ulong)local_24 * 4),
                          (uint)*(byte *)(local_d8 + 2 + (ulong)local_24 * 4));
          local_38 = &local_128;
          local_3c = (uint)*(byte *)(local_e0 + (local_100 - 3));
          local_48 = local_d8;
          BIT_addBitsFast(local_38,(ulong)*(ushort *)(local_d8 + (ulong)local_3c * 4),
                          (uint)*(byte *)(local_d8 + 2 + (ulong)local_3c * 4));
          local_50 = &local_128;
          local_54 = (uint)*(byte *)(local_e0 + (local_100 - 4));
          local_60 = local_d8;
          BIT_addBitsFast(local_50,(ulong)*(ushort *)(local_d8 + (ulong)local_54 * 4),
                          (uint)*(byte *)(local_d8 + 2 + (ulong)local_54 * 4));
          BIT_flushBits(bitC_00);
        }
        local_b0 = BIT_closeCStream(in_stack_fffffffffffffe98);
      }
    }
    else {
      local_b0 = 0;
    }
  }
  return local_b0;
}

Assistant:

size_t
HUF_compress1X_usingCTable_internal_bmi2(void* dst, size_t dstSize,
                                   const void* src, size_t srcSize,
                                   const HUF_CElt* CTable)
{
    return HUF_compress1X_usingCTable_internal_body(dst, dstSize, src, srcSize, CTable);
}